

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O2

BigInt * __thiscall BigInt::operator%=(BigInt *this,BigInt *b)

{
  BigInt local_30;
  
  operator%(&local_30,this,b);
  operator=(this,&local_30);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_30);
  return this;
}

Assistant:

BigInt& BigInt::operator%=(BigInt&& b) {
    *this = *this % b;
    return *this;
}